

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O0

UBool __thiscall
icu_63::SimpleTimeZone::getPreviousTransition
          (SimpleTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  AnnualTimeZoneRule *pAVar1;
  double dVar2;
  UBool UVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  UBool dstAvail;
  double dStack_50;
  UBool stdAvail;
  UDate dstDate;
  UDate stdDate;
  UDate firstTransitionTime;
  TimeZoneTransition *pTStack_30;
  UErrorCode status;
  TimeZoneTransition *result_local;
  UDate UStack_20;
  UBool inclusive_local;
  UDate base_local;
  SimpleTimeZone *this_local;
  
  if (this->useDaylight == '\0') {
    this_local._7_1_ = '\0';
  }
  else {
    firstTransitionTime._4_4_ = U_ZERO_ERROR;
    pTStack_30 = result;
    result_local._7_1_ = inclusive;
    UStack_20 = base;
    base_local = (UDate)this;
    checkTransitionRules(this,(UErrorCode *)((long)&firstTransitionTime + 4));
    UVar3 = ::U_FAILURE(firstTransitionTime._4_4_);
    if (UVar3 == '\0') {
      stdDate = TimeZoneTransition::getTime(this->firstTransition);
      dVar2 = UStack_20;
      if ((UStack_20 < stdDate) ||
         (((result_local._7_1_ == '\0' && (UStack_20 == stdDate)) &&
          (!NAN(UStack_20) && !NAN(stdDate))))) {
        this_local._7_1_ = '\0';
      }
      else {
        pAVar1 = this->stdRule;
        uVar4 = TimeZoneRule::getRawOffset(&this->dstRule->super_TimeZoneRule);
        uVar5 = TimeZoneRule::getDSTSavings(&this->dstRule->super_TimeZoneRule);
        iVar6 = (*(pAVar1->super_TimeZoneRule).super_UObject._vptr_UObject[10])
                          (dVar2,pAVar1,(ulong)uVar4,(ulong)uVar5,
                           (ulong)(uint)(int)result_local._7_1_,&dstDate);
        dVar2 = UStack_20;
        pAVar1 = this->dstRule;
        uVar4 = TimeZoneRule::getRawOffset(&this->stdRule->super_TimeZoneRule);
        uVar5 = TimeZoneRule::getDSTSavings(&this->stdRule->super_TimeZoneRule);
        iVar7 = (*(pAVar1->super_TimeZoneRule).super_UObject._vptr_UObject[10])
                          (dVar2,pAVar1,(ulong)uVar4,(ulong)uVar5,
                           (ulong)(uint)(int)result_local._7_1_,&stack0xffffffffffffffb0);
        if (((char)iVar6 == '\0') || (((char)iVar7 != '\0' && (dstDate <= dStack_50)))) {
          if (((char)iVar7 == '\0') || (((char)iVar6 != '\0' && (dStack_50 <= dstDate)))) {
            this_local._7_1_ = '\0';
          }
          else {
            TimeZoneTransition::setTime(pTStack_30,dStack_50);
            TimeZoneTransition::setFrom(pTStack_30,&this->stdRule->super_TimeZoneRule);
            TimeZoneTransition::setTo(pTStack_30,&this->dstRule->super_TimeZoneRule);
            this_local._7_1_ = '\x01';
          }
        }
        else {
          TimeZoneTransition::setTime(pTStack_30,dstDate);
          TimeZoneTransition::setFrom(pTStack_30,&this->dstRule->super_TimeZoneRule);
          TimeZoneTransition::setTo(pTStack_30,&this->stdRule->super_TimeZoneRule);
          this_local._7_1_ = '\x01';
        }
      }
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
SimpleTimeZone::getPreviousTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    if (!useDaylight) {
        return FALSE;
    }

    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    UDate firstTransitionTime = firstTransition->getTime();
    if (base < firstTransitionTime || (!inclusive && base == firstTransitionTime)) {
        return FALSE;
    }
    UDate stdDate, dstDate;
    UBool stdAvail = stdRule->getPreviousStart(base, dstRule->getRawOffset(), dstRule->getDSTSavings(), inclusive, stdDate);
    UBool dstAvail = dstRule->getPreviousStart(base, stdRule->getRawOffset(), stdRule->getDSTSavings(), inclusive, dstDate);
    if (stdAvail && (!dstAvail || stdDate > dstDate)) {
        result.setTime(stdDate);
        result.setFrom((const TimeZoneRule&)*dstRule);
        result.setTo((const TimeZoneRule&)*stdRule);
        return TRUE;
    }
    if (dstAvail && (!stdAvail || dstDate > stdDate)) {
        result.setTime(dstDate);
        result.setFrom((const TimeZoneRule&)*stdRule);
        result.setTo((const TimeZoneRule&)*dstRule);
        return TRUE;
    }
    return FALSE;
}